

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O1

Board * __thiscall Nonogram::get_board(Nonogram *this,int index)

{
  if (index < 0) {
    index = index + (int)((ulong)((long)(this->m_boards).
                                        super__Vector_base<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>,_std::allocator<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_boards).
                                       super__Vector_base<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>,_std::allocator<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555;
  }
  return (this->m_boards).
         super__Vector_base<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>,_std::allocator<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + index;
}

Assistant:

const Board &Nonogram::get_board(int index) const {
    if (index < 0) {
        index += m_boards.size();
    }
    return m_boards[index];
}